

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void VW::finish_example(vw *all,multi_ex *ec_seq)

{
  bool bVar1;
  reference ppeVar2;
  example *ec;
  iterator __end1;
  iterator __begin1;
  multi_ex *__range1;
  example *in_stack_ffffffffffffffc8;
  example *in_stack_ffffffffffffffd0;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_20 [4];
  
  local_20[0]._M_current =
       (example **)
       std::vector<example_*,_std::allocator<example_*>_>::begin
                 ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffffffc8);
  std::vector<example_*,_std::allocator<example_*>_>::end
            ((vector<example_*,_std::allocator<example_*>_> *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppeVar2 = __gnu_cxx::
              __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
              operator*(local_20);
    in_stack_ffffffffffffffd0 = *ppeVar2;
    finish_example((vw *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
    operator++(local_20);
  }
  std::vector<example_*,_std::allocator<example_*>_>::clear
            ((vector<example_*,_std::allocator<example_*>_> *)0x2f5392);
  return;
}

Assistant:

void finish_example(vw& all, multi_ex& ec_seq)
{
  for (auto ec : ec_seq) finish_example(all, *ec);
  ec_seq.clear();
}